

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

int_fast32_t absl::lts_20240722::time_internal::cctz::anon_unknown_0::Decode32(char *cp)

{
  byte bVar1;
  uint_fast32_t s32maxU;
  int_fast32_t s32max;
  char *pcStack_20;
  int i;
  uint_fast32_t v;
  char *cp_local;
  
  pcStack_20 = (char *)0x0;
  v = (uint_fast32_t)cp;
  for (s32max._4_4_ = 0; s32max._4_4_ != 4; s32max._4_4_ = s32max._4_4_ + 1) {
    bVar1 = Decode8((char *)v);
    pcStack_20 = (char *)((long)pcStack_20 << 8 | (ulong)bVar1);
    v = v + 1;
  }
  if (pcStack_20 < (char *)0x80000000) {
    cp_local = pcStack_20;
  }
  else {
    cp_local = pcStack_20 + -0x100000000;
  }
  return (int_fast32_t)cp_local;
}

Assistant:

std::int_fast32_t Decode32(const char* cp) {
  std::uint_fast32_t v = 0;
  for (int i = 0; i != (32 / 8); ++i) v = (v << 8) | Decode8(cp++);
  const std::int_fast32_t s32max = 0x7fffffff;
  const auto s32maxU = static_cast<std::uint_fast32_t>(s32max);
  if (v <= s32maxU) return static_cast<std::int_fast32_t>(v);
  return static_cast<std::int_fast32_t>(v - s32maxU - 1) - s32max - 1;
}